

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cesl_mpsc_llfifo.c
# Opt level: O2

int cesl_mpsc_llfifo_create
              (cesl_mpsc_llfifo_t *self,size_t elem_max_size,size_t elems_max_count,
              char *fifo_buffer)

{
  bool bVar1;
  
  bVar1 = (elems_max_count & elems_max_count - 1) == 0;
  if (bVar1) {
    self->elem_max_size_ = elem_max_size;
    self->elems_max_count_ = elems_max_count;
    self->fifo_buffer_ = fifo_buffer;
    LOCK();
    self->write_index_ = 0;
    UNLOCK();
    LOCK();
    self->read_index_ = 0;
    UNLOCK();
  }
  return (uint)bVar1;
}

Assistant:

int cesl_mpsc_llfifo_create(cesl_mpsc_llfifo_t* self, size_t elem_max_size, size_t elems_max_count, char* fifo_buffer)
{
    // Check that elems_max_count is a power of 2!
    if( (elems_max_count & (elems_max_count-1)) != 0) {
        return 0;
    }

    self->elem_max_size_ = elem_max_size;
    self->elems_max_count_ = elems_max_count;
    self->fifo_buffer_ = fifo_buffer;
    cesl_mpsc_llfifo_write_index_set(self, 0);
    cesl_mpsc_llfifo_read_index_set(self, 0);
    return 1;
}